

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O1

void __thiscall
QOpenGLShaderProgram::setUniformValue(QOpenGLShaderProgram *this,char *name,QPoint *point)

{
  int location;
  
  location = uniformLocation(this,name);
  setUniformValue(this,location,point);
  return;
}

Assistant:

void QOpenGLShaderProgram::setUniformValue(const char *name, const QPoint& point)
{
    setUniformValue(uniformLocation(name), point);
}